

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O1

void TTD::NSSnapType::EmitPropertyRecordAsSnapPropertyRecord
               (PropertyRecord *pRecord,FileWriter *writer,Separator separator)

{
  undefined7 in_register_00000011;
  
  (*writer->_vptr_FileWriter[6])(writer,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  FileWriter::WriteUInt32(writer,propertyId,pRecord->pid,NoSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,0x54,(ulong)pRecord->isNumeric,1);
  (*writer->_vptr_FileWriter[0xc])(writer,0x53,(ulong)pRecord->isBound,1);
  (*writer->_vptr_FileWriter[0xc])(writer,0x55,(ulong)pRecord->isSymbol,1);
  (*writer->_vptr_FileWriter[3])(writer,0x37,1);
  (*writer->_vptr_FileWriter[0x18])(writer,pRecord + 1,(ulong)(pRecord->byteCount >> 1),0);
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitPropertyRecordAsSnapPropertyRecord(const Js::PropertyRecord* pRecord, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            writer->WriteUInt32(NSTokens::Key::propertyId, pRecord->GetPropertyId());

            writer->WriteBool(NSTokens::Key::isNumeric, pRecord->IsNumeric(), NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::isBound, pRecord->IsBound(), NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::isSymbol, pRecord->IsSymbol(), NSTokens::Separator::CommaSeparator);

            writer->WriteKey(NSTokens::Key::name, NSTokens::Separator::CommaSeparator);
            writer->WriteInlinePropertyRecordName(pRecord->GetBuffer(), pRecord->GetLength());

            writer->WriteRecordEnd();
        }